

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
 __thiscall
phmap::priv::
base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
::
iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>const,int_const&,int_const*>,std::_Rb_tree_const_iterator<int>>
          (base_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
           *this,btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
                 tree_iter,_Rb_tree_const_iterator<int> checker_iter)

{
  template_ElementType<2UL> *ptVar1;
  const_iterator cVar2;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
  bVar3;
  
  cVar2 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>::
          end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
               *)this);
  if (cVar2.position == tree_iter.position &&
      (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *)
      cVar2.node ==
      (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>> *)
      tree_iter.node) {
    if ((_Base_ptr)(this + 0x28) != checker_iter._M_node) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x7d,
                    "IterType phmap::priv::base_checker<phmap::btree_multiset<int>, std::multiset<int>>::iter_check(IterType, CheckerIterType) const [TreeType = phmap::btree_multiset<int>, CheckerType = std::multiset<int>, IterType = phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>>, const int &, const int *>, CheckerIterType = std::_Rb_tree_const_iterator<int>]"
                   );
    }
  }
  else {
    ptVar1 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>
                              *)tree_iter.node);
    (anonymous_namespace)::CheckPairEquals<int,int>
              (ptVar1 + tree_iter.position,(int *)(checker_iter._M_node + 1));
  }
  bVar3._12_4_ = 0;
  bVar3.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)SUB128(tree_iter._0_12_,0);
  bVar3.position = SUB124(tree_iter._0_12_,8);
  return bVar3;
}

Assistant:

IterType iter_check(IterType tree_iter, CheckerIterType checker_iter) const {
        if (tree_iter == tree_.end()) {
            PHMAP_INTERNAL_CHECK(checker_iter == checker_.end(),
                                 "Checker iterator not at end.");
        } else {
            CheckPairEquals(*tree_iter, *checker_iter);
        }
        return tree_iter;
    }